

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  
  iVar2 = 1;
  if ((chrm != (spng_chrm *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar2 = read_chunks(ctx,0), iVar2 == 0)))) {
    dVar4 = chrm->white_point_x * 100000.0;
    dVar6 = chrm->white_point_y * 100000.0;
    dVar9 = chrm->red_x * 100000.0;
    dVar10 = chrm->red_y * 100000.0;
    iVar2 = (int)dVar9;
    iVar11 = (int)dVar10;
    uVar1 = CONCAT44((int)(dVar10 - 2147483648.0),(int)(dVar9 - 2147483648.0)) &
            CONCAT44(iVar11 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar11,iVar2);
    iVar2 = (int)dVar4;
    iVar11 = (int)dVar6;
    uVar5 = CONCAT44((int)(dVar6 - 2147483648.0),(int)(dVar4 - 2147483648.0)) &
            CONCAT44(iVar11 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar11,iVar2);
    dVar4 = chrm->green_x * 100000.0;
    dVar6 = chrm->green_y * 100000.0;
    dVar9 = chrm->blue_x * 100000.0;
    dVar10 = chrm->blue_y * 100000.0;
    iVar2 = (int)dVar9;
    iVar11 = (int)dVar10;
    uVar8 = CONCAT44((int)(dVar10 - 2147483648.0),(int)(dVar9 - 2147483648.0)) &
            CONCAT44(iVar11 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar11,iVar2);
    iVar2 = (int)dVar4;
    iVar11 = (int)dVar6;
    auVar3._0_8_ = CONCAT44((int)(dVar6 - 2147483648.0),(int)(dVar4 - 2147483648.0)) &
                   CONCAT44(iVar11 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar11,iVar2);
    auVar3._8_8_ = uVar8;
    auVar7._8_8_ = uVar1;
    auVar7._0_8_ = uVar5;
    auVar7 = packssdw(auVar7,auVar3);
    iVar2 = 0x22;
    if ((((((((auVar7 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar7 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar7 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar7 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar7 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar7 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar7 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar7[0xf]) {
      (ctx->chrm_int).white_point_x = (int)uVar5;
      (ctx->chrm_int).white_point_y = (int)(uVar5 >> 0x20);
      (ctx->chrm_int).red_x = (int)uVar1;
      (ctx->chrm_int).red_y = (int)(uVar1 >> 0x20);
      (ctx->chrm_int).green_x = (int)auVar3._0_8_;
      (ctx->chrm_int).green_y = (int)(auVar3._0_8_ >> 0x20);
      (ctx->chrm_int).blue_x = (int)uVar8;
      (ctx->chrm_int).blue_y = (int)(uVar8 >> 0x20);
      uVar1._0_4_ = ctx->user;
      uVar1._4_4_ = ctx->stored;
      ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x400000004);
      ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x400000004) >> 0x20);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int spng_set_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm);

    struct spng_chrm_int chrm_int;

    chrm_int.white_point_x = (uint32_t)(chrm->white_point_x * 100000.0);
    chrm_int.white_point_y = (uint32_t)(chrm->white_point_y * 100000.0);
    chrm_int.red_x = (uint32_t)(chrm->red_x * 100000.0);
    chrm_int.red_y = (uint32_t)(chrm->red_y * 100000.0);
    chrm_int.green_x = (uint32_t)(chrm->green_x * 100000.0);
    chrm_int.green_y = (uint32_t)(chrm->green_y * 100000.0);
    chrm_int.blue_x = (uint32_t)(chrm->blue_x * 100000.0);
    chrm_int.blue_y = (uint32_t)(chrm->blue_y * 100000.0);

    if(check_chrm_int(&chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}